

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O1

void anon_unknown.dwarf_2299d::testSetSampleCounts(Box2i *dataWindow)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float *pfVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  Box2i *pBVar6;
  ostream *poVar7;
  TypedDeepImageChannel<float> *pTVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  uint newNumSamples;
  ulong uVar14;
  Rand48 random;
  float oldSamples [20];
  DeepImage img;
  ushort local_10e [3];
  DeepImageLevel *local_108;
  SampleCountChannel *local_100;
  Box2i *local_f8;
  ulong local_f0;
  string local_e8 [2];
  Image local_98;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"change sample counts, data window = (",0x25);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(dataWindow->min).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(dataWindow->min).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,") - (",5);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(dataWindow->max).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(dataWindow->max).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  Imf_2_5::DeepImage::DeepImage((DeepImage *)&local_98);
  Imf_2_5::Image::resize(&local_98,dataWindow,ONE_LEVEL,ROUND_DOWN);
  paVar1 = &local_e8[0].field_2;
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"F","");
  Imf_2_5::Image::insertChannel(&local_98,local_e8,FLOAT,1,1,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  local_10e[0] = 0x5a5a;
  local_10e[1] = 0x5a5a;
  local_10e[2] = 0x5a5a;
  local_108 = Imf_2_5::DeepImage::level((DeepImage *)&local_98,0);
  local_e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"F","");
  pTVar8 = Imf_2_5::DeepImageLevel::typedChannel<float>(local_108,local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8[0]._M_dataplus._M_p,local_e8[0].field_2._M_allocated_capacity + 1);
  }
  if ((pTVar8->super_DeepImageChannel).super_ImageChannel._numPixels != 0) {
    local_100 = &local_108->_sampleCounts;
    uVar14 = 0;
    local_f8 = dataWindow;
    do {
      pBVar6 = local_f8;
      iVar13 = (local_f8->min).x;
      lVar9 = Imath_2_5::nrand48(local_10e);
      iVar3 = (pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow;
      iVar12 = (pBVar6->min).y;
      lVar10 = Imath_2_5::nrand48(local_10e);
      iVar13 = iVar13 + (int)(lVar9 % (long)iVar3);
      iVar12 = iVar12 + (int)(lVar10 % (long)(pTVar8->super_DeepImageChannel).super_ImageChannel.
                                             _pixelsPerColumn);
      local_f0 = uVar14;
      Imf_2_5::ImageChannel::boundsCheck(&local_100->super_ImageChannel,iVar13,iVar12);
      uVar4 = (local_108->_sampleCounts)._base
              [(local_108->_sampleCounts).super_ImageChannel._pixelsPerRow * iVar12 + iVar13];
      lVar9 = Imath_2_5::nrand48(local_10e);
      if (0 < (int)uVar4) {
        memcpy(local_e8,pTVar8->_base
                        [(pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow * iVar12
                         + iVar13],(ulong)uVar4 * 4);
      }
      uVar14 = lVar9 + (lVar9 / 0x15) * -0x15 + (lVar9 / -0x5800000000000000) * 0x15;
      newNumSamples = (uint)uVar14;
      Imf_2_5::SampleCountChannel::set(local_100,iVar13,iVar12,newNumSamples);
      if ((int)uVar4 < (int)newNumSamples) {
        if (0 < (int)uVar4) {
          uVar11 = 0;
          do {
            pfVar2 = (float *)((long)&local_e8[0]._M_dataplus._M_p + uVar11 * 4);
            if ((pTVar8->_base
                 [(pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow * iVar12 +
                  iVar13][uVar11] != *pfVar2) ||
               (NAN(pTVar8->_base
                    [(pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow * iVar12 +
                     iVar13][uVar11]) || NAN(*pfVar2))) {
              __assert_fail("channel(x, y)[j] == oldSamples[j]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                            ,0x1e9,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)")
              ;
            }
            uVar11 = uVar11 + 1;
          } while (uVar4 != uVar11);
        }
        if ((int)uVar4 < (int)newNumSamples) {
          uVar11 = (ulong)(int)uVar4;
          do {
            if ((pTVar8->_base
                 [(pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow * iVar12 +
                  iVar13][uVar11] != 0.0) ||
               (NAN(pTVar8->_base
                    [(pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow * iVar12 +
                     iVar13][uVar11]))) {
              __assert_fail("channel(x, y)[j] == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                            ,0x1ed,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)")
              ;
            }
            dVar5 = (double)Imath_2_5::erand48(local_10e);
            pTVar8->_base
            [(pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow * iVar12 + iVar13]
            [uVar11] = (float)dVar5;
            uVar11 = uVar11 + 1;
          } while (uVar14 != uVar11);
        }
      }
      else if (0 < (long)uVar14) {
        uVar11 = 0;
        do {
          pfVar2 = (float *)((long)&local_e8[0]._M_dataplus._M_p + uVar11 * 4);
          if ((pTVar8->_base
               [iVar12 * (pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow + iVar13]
               [uVar11] != *pfVar2) ||
             (NAN(pTVar8->_base
                  [iVar12 * (pTVar8->super_DeepImageChannel).super_ImageChannel._pixelsPerRow +
                   iVar13][uVar11]) || NAN(*pfVar2))) {
            __assert_fail("channel(x, y)[j] == oldSamples[j]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                          ,500,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
          }
          uVar11 = uVar11 + 1;
        } while ((uVar14 & 0xffffffff) != uVar11);
      }
      uVar14 = local_f0 + 1;
    } while (uVar14 < (pTVar8->super_DeepImageChannel).super_ImageChannel._numPixels);
  }
  Imf_2_5::DeepImage::~DeepImage((DeepImage *)&local_98);
  return;
}

Assistant:

void
testSetSampleCounts (const Box2i &dataWindow)
{
    cout << "change sample counts, data window = "
            "(" << dataWindow.min.x << ", " << dataWindow.min.y << ") - "
            "(" << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    DeepImage img;
    img.resize (dataWindow, ONE_LEVEL, ROUND_DOWN);
    img.insertChannel ("F", FLOAT, 1, 1, false);

    Rand48 random (0);

    DeepImageLevel &level = img.level();
    DeepFloatChannel &channel = level.typedChannel <float> ("F");
    SampleCountChannel &sampleCounts = level.sampleCounts();

    const int MAX_SAMPLES = 20;

    for (size_t i = 0; i < channel.numPixels(); ++i)
    {
        int x = dataWindow.min.x + random.nexti() % channel.pixelsPerRow();
        int y = dataWindow.min.y + random.nexti() % channel.pixelsPerColumn();

        int oldN = sampleCounts.at (x, y);
        int newN = random.nexti() % (MAX_SAMPLES + 1);

        float oldSamples[MAX_SAMPLES];
        
        for (int j = 0; j < oldN; ++j)
            oldSamples[j] = channel(x, y)[j];

        sampleCounts.set (x, y, newN);

        if (newN > oldN)
        {
            for (int j = 0; j < oldN; ++j)
                assert (channel(x, y)[j] == oldSamples[j]);

            for (int j = oldN; j < newN; ++j)
            {
                assert (channel(x, y)[j] == 0);
                channel(x, y)[j] = random.nextf();
            }
        }
        else
        {
            for (int j = 0; j < newN; ++j)
                assert (channel(x, y)[j] == oldSamples[j]);
        }
    }
}